

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::PushLine(Hunk *this,char edit,char *line)

{
  pair<char,_const_char_*> pVar1;
  char local_61;
  value_type local_60;
  char local_49;
  value_type local_48;
  char local_31;
  value_type local_30;
  char *local_20;
  char *line_local;
  Hunk *pHStack_10;
  char edit_local;
  Hunk *this_local;
  
  local_20 = line;
  line_local._7_1_ = edit;
  pHStack_10 = this;
  if (edit == ' ') {
    this->common_ = this->common_ + 1;
    FlushEdits(this);
    local_31 = ' ';
    pVar1 = std::make_pair<char,char_const*&>(&local_31,&local_20);
    local_30.second = pVar1.second;
    local_30.first = pVar1.first;
    std::__cxx11::
    list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::push_back
              (&this->hunk_,&local_30);
  }
  else if (edit == '+') {
    this->adds_ = this->adds_ + 1;
    local_61 = '+';
    pVar1 = std::make_pair<char,char_const*&>(&local_61,&local_20);
    local_60.second = pVar1.second;
    local_60.first = pVar1.first;
    std::__cxx11::
    list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::push_back
              (&this->hunk_adds_,&local_60);
  }
  else if (edit == '-') {
    this->removes_ = this->removes_ + 1;
    local_49 = '-';
    pVar1 = std::make_pair<char,char_const*&>(&local_49,&local_20);
    local_48.second = pVar1.second;
    local_48.first = pVar1.first;
    std::__cxx11::
    list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::push_back
              (&this->hunk_removes_,&local_48);
  }
  return;
}

Assistant:

void PushLine(char edit, const char* line) {
    switch (edit) {
      case ' ':
        ++common_;
        FlushEdits();
        hunk_.push_back(std::make_pair(' ', line));
        break;
      case '-':
        ++removes_;
        hunk_removes_.push_back(std::make_pair('-', line));
        break;
      case '+':
        ++adds_;
        hunk_adds_.push_back(std::make_pair('+', line));
        break;
    }
  }